

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

void __thiscall VertexAttrib64Bit::VAOTest::initBuffers(VAOTest *this)

{
  short sVar1;
  ushort uVar2;
  uchar *puVar3;
  uchar *puVar4;
  unsigned_short *puVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int iVar18;
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  int iVar36;
  int iVar39;
  undefined1 auVar37 [16];
  int iVar40;
  undefined1 auVar38 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar42 [16];
  
  uVar7 = this->m_bo_1_batch_size;
  uVar8 = this->m_n_batches;
  uVar6 = (ulong)uVar8;
  uVar13 = uVar8 * uVar7;
  this->m_bo_1_data_size = uVar13;
  uVar16 = this->m_bo_2_batch_size * uVar8;
  this->m_bo_2_data_size = uVar16;
  this->m_bo_index_data_size = uVar8 * 2;
  puVar3 = (uchar *)operator_new__((ulong)uVar13);
  this->m_bo_1_data = puVar3;
  puVar4 = (uchar *)operator_new__((ulong)uVar16);
  this->m_bo_2_data = puVar4;
  puVar5 = (unsigned_short *)operator_new__((ulong)(uVar8 * 2));
  this->m_bo_index_data = puVar5;
  auVar24 = _DAT_019f5ce0;
  if ((uVar8 & 0xffff) != 0) {
    lVar10 = (uVar6 & 0xffff) - 1;
    auVar17._8_4_ = (int)lVar10;
    auVar17._0_8_ = lVar10;
    auVar17._12_4_ = (int)((ulong)lVar10 >> 0x20);
    iVar9 = uVar8 - 1;
    uVar12 = 0;
    auVar17 = auVar17 ^ _DAT_019f5ce0;
    auVar26._8_4_ = 0xffffffff;
    auVar26._0_8_ = 0xffffffffffffffff;
    auVar26._12_4_ = 0xffffffff;
    auVar20 = _DAT_01a9b020;
    auVar21 = _DAT_01a9b030;
    auVar22 = _DAT_01a25df0;
    auVar23 = _DAT_019fcc00;
    do {
      auVar27 = auVar23 ^ auVar24;
      iVar36 = auVar17._0_4_;
      iVar35 = -(uint)(iVar36 < auVar27._0_4_);
      iVar18 = auVar17._4_4_;
      auVar28._4_4_ = -(uint)(iVar18 < auVar27._4_4_);
      iVar40 = auVar17._8_4_;
      iVar39 = -(uint)(iVar40 < auVar27._8_4_);
      iVar19 = auVar17._12_4_;
      auVar28._12_4_ = -(uint)(iVar19 < auVar27._12_4_);
      auVar33._4_4_ = iVar35;
      auVar33._0_4_ = iVar35;
      auVar33._8_4_ = iVar39;
      auVar33._12_4_ = iVar39;
      auVar41 = pshuflw(in_XMM11,auVar33,0xe8);
      auVar31._4_4_ = -(uint)(auVar27._4_4_ == iVar18);
      auVar31._12_4_ = -(uint)(auVar27._12_4_ == iVar19);
      auVar31._0_4_ = auVar31._4_4_;
      auVar31._8_4_ = auVar31._12_4_;
      auVar42 = pshuflw(in_XMM12,auVar31,0xe8);
      auVar28._0_4_ = auVar28._4_4_;
      auVar28._8_4_ = auVar28._12_4_;
      auVar27 = pshuflw(auVar41,auVar28,0xe8);
      auVar27 = (auVar27 | auVar42 & auVar41) ^ auVar26;
      auVar27 = packssdw(auVar27,auVar27);
      if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar5[uVar12] = (unsigned_short)iVar9;
      }
      auVar28 = auVar31 & auVar33 | auVar28;
      auVar27 = packssdw(auVar28,auVar28);
      auVar27 = packssdw(auVar27 ^ auVar26,auVar27 ^ auVar26);
      sVar1 = (short)uVar8;
      uVar2 = (ushort)uVar12;
      if ((auVar27._0_4_ >> 0x10 & 1) != 0) {
        puVar5[uVar12 + 1] = (uVar2 ^ 0xfffe) + sVar1;
      }
      auVar31 = auVar22 ^ auVar24;
      iVar35 = -(uint)(iVar36 < auVar31._0_4_);
      auVar37._4_4_ = -(uint)(iVar18 < auVar31._4_4_);
      iVar39 = -(uint)(iVar40 < auVar31._8_4_);
      auVar37._12_4_ = -(uint)(iVar19 < auVar31._12_4_);
      auVar27._4_4_ = iVar35;
      auVar27._0_4_ = iVar35;
      auVar27._8_4_ = iVar39;
      auVar27._12_4_ = iVar39;
      auVar32._4_4_ = -(uint)(auVar31._4_4_ == iVar18);
      auVar32._12_4_ = -(uint)(auVar31._12_4_ == iVar19);
      auVar32._0_4_ = auVar32._4_4_;
      auVar32._8_4_ = auVar32._12_4_;
      auVar37._0_4_ = auVar37._4_4_;
      auVar37._8_4_ = auVar37._12_4_;
      auVar31 = auVar32 & auVar27 | auVar37;
      auVar31 = packssdw(auVar31,auVar31);
      auVar31 = packssdw(auVar31 ^ auVar26,auVar31 ^ auVar26);
      if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar5[uVar12 + 2] = (uVar2 ^ 0xfffd) + sVar1;
      }
      auVar27 = pshufhw(auVar27,auVar27,0x84);
      auVar33 = pshufhw(auVar32,auVar32,0x84);
      auVar28 = pshufhw(auVar27,auVar37,0x84);
      auVar27 = (auVar28 | auVar33 & auVar27) ^ auVar26;
      auVar27 = packssdw(auVar27,auVar27);
      if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar5[uVar12 + 3] = (uVar2 ^ 0xfffc) + sVar1;
      }
      auVar27 = auVar21 ^ auVar24;
      iVar35 = -(uint)(iVar36 < auVar27._0_4_);
      auVar30._4_4_ = -(uint)(iVar18 < auVar27._4_4_);
      iVar39 = -(uint)(iVar40 < auVar27._8_4_);
      auVar30._12_4_ = -(uint)(iVar19 < auVar27._12_4_);
      auVar34._4_4_ = iVar35;
      auVar34._0_4_ = iVar35;
      auVar34._8_4_ = iVar39;
      auVar34._12_4_ = iVar39;
      auVar31 = pshuflw(auVar31,auVar34,0xe8);
      auVar29._4_4_ = -(uint)(auVar27._4_4_ == iVar18);
      auVar29._12_4_ = -(uint)(auVar27._12_4_ == iVar19);
      auVar29._0_4_ = auVar29._4_4_;
      auVar29._8_4_ = auVar29._12_4_;
      in_XMM12 = pshuflw(auVar42 & auVar41,auVar29,0xe8);
      in_XMM12 = in_XMM12 & auVar31;
      auVar30._0_4_ = auVar30._4_4_;
      auVar30._8_4_ = auVar30._12_4_;
      auVar27 = pshuflw(auVar31,auVar30,0xe8);
      auVar27 = (auVar27 | in_XMM12) ^ auVar26;
      auVar27 = packssdw(auVar27,auVar27);
      if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar5[uVar12 + 4] = (uVar2 ^ 0xfffb) + sVar1;
      }
      auVar30 = auVar29 & auVar34 | auVar30;
      auVar27 = packssdw(auVar30,auVar30);
      auVar27 = packssdw(auVar27 ^ auVar26,auVar27 ^ auVar26);
      if ((auVar27 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        puVar5[uVar12 + 5] = (uVar2 ^ 0xfffa) + sVar1;
      }
      auVar27 = auVar20 ^ auVar24;
      iVar36 = -(uint)(iVar36 < auVar27._0_4_);
      auVar38._4_4_ = -(uint)(iVar18 < auVar27._4_4_);
      iVar40 = -(uint)(iVar40 < auVar27._8_4_);
      auVar38._12_4_ = -(uint)(iVar19 < auVar27._12_4_);
      auVar41._4_4_ = iVar36;
      auVar41._0_4_ = iVar36;
      auVar41._8_4_ = iVar40;
      auVar41._12_4_ = iVar40;
      auVar42._4_4_ = -(uint)(auVar27._4_4_ == iVar18);
      auVar42._12_4_ = -(uint)(auVar27._12_4_ == iVar19);
      auVar42._0_4_ = auVar42._4_4_;
      auVar42._8_4_ = auVar42._12_4_;
      auVar38._0_4_ = auVar38._4_4_;
      auVar38._8_4_ = auVar38._12_4_;
      auVar27 = auVar42 & auVar41 | auVar38;
      auVar27 = packssdw(auVar27,auVar27);
      in_XMM11 = packssdw(auVar27 ^ auVar26,auVar27 ^ auVar26);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar5[uVar12 + 6] = (uVar2 ^ 0xfff9) + sVar1;
      }
      auVar27 = pshufhw(auVar41,auVar41,0x84);
      auVar28 = pshufhw(auVar42,auVar42,0x84);
      auVar31 = pshufhw(auVar27,auVar38,0x84);
      auVar27 = (auVar31 | auVar28 & auVar27) ^ auVar26;
      auVar27 = packssdw(auVar27,auVar27);
      if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar5[uVar12 + 7] = (uVar2 ^ 0xfff8) + sVar1;
      }
      uVar12 = uVar12 + 8;
      lVar10 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 8;
      auVar23._8_8_ = lVar10 + 8;
      lVar10 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 8;
      auVar22._8_8_ = lVar10 + 8;
      lVar10 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 8;
      auVar21._8_8_ = lVar10 + 8;
      lVar10 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 8;
      auVar20._8_8_ = lVar10 + 8;
      iVar9 = iVar9 + -8;
    } while (((int)(uVar6 & 0xffff) + 7U & 0xfffffff8) != uVar12);
  }
  auVar20 = _DAT_019fcc00;
  auVar24 = _DAT_019f5ce0;
  if (uVar6 != 0) {
    uVar8 = this->m_bo_1_offset_matrix;
    uVar13 = 0;
    uVar16 = 2;
    uVar12 = 0;
    do {
      lVar10 = (ulong)uVar13 + (ulong)uVar8;
      lVar14 = 1;
      auVar25 = auVar20;
      uVar15 = uVar16;
      do {
        if (SUB164(auVar25 ^ auVar24,4) == -0x80000000 && SUB164(auVar25 ^ auVar24,0) < -0x7ffffff7)
        {
          *(double *)(puVar3 + lVar14 * 8 + lVar10 + -8) = (double)(uVar15 - 1);
          *(double *)(puVar3 + lVar14 * 8 + lVar10) = (double)uVar15;
        }
        lVar11 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 2;
        auVar25._8_8_ = lVar11 + 2;
        lVar14 = lVar14 + 2;
        uVar15 = uVar15 + 2;
      } while (lVar14 != 0xb);
      uVar12 = uVar12 + 1;
      uVar13 = uVar13 + uVar7;
      uVar16 = uVar16 + 9;
    } while (uVar12 != uVar6);
    if (uVar6 != 0) {
      uVar7 = 0;
      do {
        this->m_bo_1_data
        [(ulong)this->m_bo_1_offset_ubyte + (ulong)(this->m_bo_1_batch_size * uVar7)] = (uchar)uVar7
        ;
        uVar7 = uVar7 + 1;
        uVar6 = (ulong)this->m_n_batches;
      } while (uVar7 < this->m_n_batches);
      if (uVar6 != 0) {
        uVar7 = this->m_bo_1_offset_short;
        uVar8 = this->m_bo_1_batch_size;
        puVar3 = this->m_bo_1_data;
        uVar13 = 0;
        uVar12 = 0;
        do {
          *(short *)(puVar3 + (ulong)uVar13 + (ulong)uVar7) = (short)uVar12;
          uVar12 = uVar12 + 1;
          uVar13 = uVar13 + uVar8;
        } while (uVar6 != uVar12);
        if (uVar6 != 0) {
          uVar7 = 0;
          uVar8 = 1;
          do {
            uVar16 = this->m_bo_1_batch_size * uVar7;
            puVar3 = this->m_bo_1_data;
            uVar13 = this->m_bo_1_offset_double;
            *(double *)(puVar3 + (ulong)uVar13 + (ulong)uVar16) = (double)(uVar8 - 1);
            *(double *)(puVar3 + (ulong)uVar13 + 8 + (ulong)uVar16) = (double)uVar8;
            uVar7 = uVar7 + 1;
            uVar8 = uVar8 + 2;
          } while (uVar7 < this->m_n_batches);
          if (this->m_n_batches != 0) {
            uVar7 = 0;
            do {
              this->m_bo_2_data
              [(ulong)this->m_bo_2_offset_sbyte + (ulong)(this->m_bo_2_batch_size * uVar7)] =
                   (uchar)uVar7;
              uVar7 = uVar7 + 1;
            } while (uVar7 < this->m_n_batches);
            if (this->m_n_batches != 0) {
              uVar6 = 0;
              do {
                uVar7 = this->m_bo_2_offset_matrix;
                auVar24._8_4_ = (int)uVar6;
                auVar24._0_8_ = uVar6;
                auVar24._12_4_ = (int)(uVar6 >> 0x20);
                uVar8 = this->m_bo_2_batch_size;
                puVar3 = this->m_bo_2_data;
                lVar11 = 0;
                lVar10 = 0;
                lVar14 = 1;
                do {
                  *(double *)(puVar3 + lVar11 * 8 + (ulong)(uVar8 * (int)uVar6) + (ulong)uVar7) =
                       (double)(lVar10 + uVar6 * 8 & 0xffffffff | 0x4330000000000000) -
                       4503599627370496.0;
                  *(double *)
                   ((long)(puVar3 + lVar11 * 8 + (ulong)(uVar8 * (int)uVar6) + (ulong)uVar7) + 8) =
                       (double)(lVar14 + auVar24._8_8_ * 8 & 0xffffffffU | 0x4330000000000000) -
                       4503599627370496.0;
                  lVar11 = lVar11 + 2;
                  lVar10 = lVar10 + 2;
                  lVar14 = lVar14 + 2;
                } while (lVar11 != 8);
                uVar6 = uVar6 + 1;
              } while (uVar6 < this->m_n_batches);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void VAOTest::initBuffers()
{
	DE_ASSERT(m_bo_1_data == DE_NULL);
	DE_ASSERT(m_bo_2_data == DE_NULL);
	DE_ASSERT(m_bo_index_data == DE_NULL);

	/* Prepare buffers storing underlying data. The buffers will be used for:
	 *
	 * - storage purposes;
	 * - verification of the data XFBed from the vertex shader.
	 */
	m_bo_1_data_size	 = m_bo_1_batch_size * m_n_batches;
	m_bo_2_data_size	 = m_bo_2_batch_size * m_n_batches;
	m_bo_index_data_size = static_cast<unsigned int>(sizeof(unsigned short) * m_n_batches);

	m_bo_1_data		= new unsigned char[m_bo_1_data_size];
	m_bo_2_data		= new unsigned char[m_bo_2_data_size];
	m_bo_index_data = new unsigned short[m_bo_index_data_size / sizeof(unsigned short)];

	/* Workaround for alignment issue that may result in bus error on some platforms */
	union {
		double		  d;
		unsigned char c[sizeof(double)];
	} u;

	/* Fill index data */
	for (unsigned short n_index = 0; n_index < (unsigned short)m_n_batches; ++n_index)
	{
		m_bo_index_data[n_index] = (unsigned short)((unsigned short)(m_n_batches - 1) - n_index);
	}

	/* Fill 3x3 matrix data in BO1 */
	for (unsigned int n_matrix = 0; n_matrix < m_n_batches; ++n_matrix)
	{
		double* matrix_ptr = (double*)(m_bo_1_data + n_matrix * m_bo_1_batch_size + m_bo_1_offset_matrix);

		for (unsigned int n_element = 0; n_element < 9 /* 3x3 matrix */; ++n_element)
		{
			matrix_ptr[n_element] = (double)(n_matrix * 3 * 3 + n_element + 1);
		}
	} /* for (all matrices) */

	/* Fill unsigned byte data in BO1 */
	for (unsigned int n_element = 0; n_element < m_n_batches; ++n_element)
	{
		unsigned char* data_ptr = m_bo_1_data + n_element * m_bo_1_batch_size + m_bo_1_offset_ubyte;

		*data_ptr = (unsigned char)n_element;
	}

	/* Fill short data in BO1 */
	for (unsigned int n_element = 0; n_element < m_n_batches; ++n_element)
	{
		unsigned short* data_ptr = (unsigned short*)(m_bo_1_data + n_element * m_bo_1_batch_size + m_bo_1_offset_short);

		*data_ptr = (unsigned short)n_element;
	}

	/* Fill 2 doubles data in BO1 */
	for (unsigned int n_batch = 0; n_batch < m_n_batches; ++n_batch)
	{
		unsigned char* data1_ptr = m_bo_1_data + n_batch * m_bo_1_batch_size + m_bo_1_offset_double;
		unsigned char* data2_ptr = data1_ptr + sizeof(double);

		u.d = (double)(2 * n_batch);
		memcpy(data1_ptr, u.c, sizeof(double));
		u.d = (double)(2 * n_batch + 1);
		memcpy(data2_ptr, u.c, sizeof(double));
	}

	/* Fill signed byte data in BO2 */
	for (unsigned int n_element = 0; n_element < m_n_batches; ++n_element)
	{
		signed char* data_ptr = (signed char*)(m_bo_2_data + n_element * m_bo_2_batch_size + m_bo_2_offset_sbyte);

		*data_ptr = (signed char)n_element;
	}

	/* Fill 4x2 matrix data in BO2 */
	for (unsigned int n_matrix = 0; n_matrix < m_n_batches; ++n_matrix)
	{
		unsigned char* matrix_ptr = m_bo_2_data + n_matrix * m_bo_2_batch_size + m_bo_2_offset_matrix;

		for (unsigned int n_element = 0; n_element < 8 /* 4x2 matrix */; ++n_element)
		{
			u.d = (double)(n_matrix * 4 * 2 + n_element);
			memcpy(matrix_ptr + (sizeof(double) * n_element), u.c, sizeof(double));
		}
	} /* for (all matrices) */
}